

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_utils.c
# Opt level: O2

void av1_update_film_grain_parameters_seq(AV1_PRIMARY *ppi,AV1EncoderConfig *oxcf)

{
  bool bVar1;
  
  bVar1 = true;
  if ((((oxcf->tune_cfg).film_grain_test_vector == 0) &&
      ((oxcf->tune_cfg).film_grain_table_filename == (char *)0x0)) &&
     ((oxcf->tune_cfg).content != AOM_CONTENT_FILM)) {
    bVar1 = 0.0 < oxcf->noise_level;
  }
  (ppi->seq_params).film_grain_params_present = bVar1;
  return;
}

Assistant:

void av1_update_film_grain_parameters_seq(struct AV1_PRIMARY *ppi,
                                          const AV1EncoderConfig *oxcf) {
  SequenceHeader *const seq_params = &ppi->seq_params;
  const TuneCfg *const tune_cfg = &oxcf->tune_cfg;

  if (tune_cfg->film_grain_test_vector || tune_cfg->film_grain_table_filename ||
      tune_cfg->content == AOM_CONTENT_FILM) {
    seq_params->film_grain_params_present = 1;
  } else {
#if CONFIG_DENOISE
    seq_params->film_grain_params_present = (oxcf->noise_level > 0);
#else
    seq_params->film_grain_params_present = 0;
#endif
  }
}